

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O0

RC __thiscall PF_BufferMgr::ClearBuffer(PF_BufferMgr *this)

{
  int iVar1;
  int local_20;
  int next;
  int slot;
  RC rc;
  PF_BufferMgr *this_local;
  
  iVar1 = this->first;
  do {
    local_20 = iVar1;
    if (local_20 == -1) {
      return 0;
    }
    iVar1 = this->bufTable[local_20].next;
  } while ((this->bufTable[local_20].pinCount != 0) ||
          (((next = PF_HashTable::Delete
                              (&this->hashTable,this->bufTable[local_20].fd,
                               this->bufTable[local_20].pageNum), next == 0 &&
            (next = Unlink(this,local_20), next == 0)) &&
           (next = InsertFree(this,local_20), next == 0))));
  return next;
}

Assistant:

RC PF_BufferMgr::ClearBuffer()
{
   RC rc;

   int slot, next;
   slot = first;
   while (slot != INVALID_SLOT) {
      next = bufTable[slot].next;
      if (bufTable[slot].pinCount == 0)
         if ((rc = hashTable.Delete(bufTable[slot].fd,
               bufTable[slot].pageNum)) ||
            (rc = Unlink(slot)) ||
            (rc = InsertFree(slot)))
         return (rc);
      slot = next;
   }

   return 0;
}